

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lottiemodel.cpp
# Opt level: O0

vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>_>_>
* __thiscall rlottie::internal::model::Composition::layerInfoList_abi_cxx11_(Composition *this)

{
  bool bVar1;
  reference ppOVar2;
  char **__args;
  vector<rlottie::internal::model::Object_*,_std::allocator<rlottie::internal::model::Object_*>_>
  *in_RSI;
  vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>_>_>
  *in_RDI;
  Layer *layer;
  Object *it;
  iterator __end1;
  iterator __begin1;
  vector<rlottie::internal::model::Object_*,_std::allocator<rlottie::internal::model::Object_*>_>
  *__range1;
  vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>_>_>
  *result;
  vector<rlottie::internal::model::Object_*,_std::allocator<rlottie::internal::model::Object_*>_>
  *in_stack_ffffffffffffff98;
  vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>_>_>
  *__args_2;
  vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>_>_>
  *this_00;
  size_type in_stack_ffffffffffffffc8;
  vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>_>_>
  *in_stack_ffffffffffffffd0;
  __normal_iterator<rlottie::internal::model::Object_**,_std::vector<rlottie::internal::model::Object_*,_std::allocator<rlottie::internal::model::Object_*>_>_>
  local_28;
  pointer local_20;
  undefined1 local_11;
  
  __args_2 = in_RDI;
  if ((in_RSI[3].
       super__Vector_base<rlottie::internal::model::Object_*,_std::allocator<rlottie::internal::model::Object_*>_>
       ._M_impl.super__Vector_impl_data._M_finish == (pointer)0x0) ||
     (bVar1 = std::
              vector<rlottie::internal::model::Object_*,_std::allocator<rlottie::internal::model::Object_*>_>
              ::empty(in_RSI), bVar1)) {
    memset(in_RDI,0,0x18);
    std::
    vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>_>_>
    ::vector((vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>_>_>
              *)0x17f0bf);
  }
  else {
    local_11 = 0;
    std::
    vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>_>_>
    ::vector((vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>_>_>
              *)0x17f0d3);
    std::
    vector<rlottie::internal::model::Object_*,_std::allocator<rlottie::internal::model::Object_*>_>
    ::size((vector<rlottie::internal::model::Object_*,_std::allocator<rlottie::internal::model::Object_*>_>
            *)(in_RSI[3].
               super__Vector_base<rlottie::internal::model::Object_*,_std::allocator<rlottie::internal::model::Object_*>_>
               ._M_impl.super__Vector_impl_data._M_finish + 2));
    std::
    vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>_>_>
    ::reserve(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
    local_20 = in_RSI[3].
               super__Vector_base<rlottie::internal::model::Object_*,_std::allocator<rlottie::internal::model::Object_*>_>
               ._M_impl.super__Vector_impl_data._M_finish + 2;
    local_28._M_current =
         (Object **)
         std::
         vector<rlottie::internal::model::Object_*,_std::allocator<rlottie::internal::model::Object_*>_>
         ::begin(in_stack_ffffffffffffff98);
    std::
    vector<rlottie::internal::model::Object_*,_std::allocator<rlottie::internal::model::Object_*>_>
    ::end(in_stack_ffffffffffffff98);
    while (bVar1 = __gnu_cxx::operator!=
                             ((__normal_iterator<rlottie::internal::model::Object_**,_std::vector<rlottie::internal::model::Object_*,_std::allocator<rlottie::internal::model::Object_*>_>_>
                               *)in_RDI,
                              (__normal_iterator<rlottie::internal::model::Object_**,_std::vector<rlottie::internal::model::Object_*,_std::allocator<rlottie::internal::model::Object_*>_>_>
                               *)in_stack_ffffffffffffff98), bVar1) {
      ppOVar2 = __gnu_cxx::
                __normal_iterator<rlottie::internal::model::Object_**,_std::vector<rlottie::internal::model::Object_*,_std::allocator<rlottie::internal::model::Object_*>_>_>
                ::operator*(&local_28);
      this_00 = (vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>_>_>
                 *)*ppOVar2;
      __args = (char **)Object::name((Object *)in_RDI);
      std::
      vector<std::tuple<std::__cxx11::string,int,int>,std::allocator<std::tuple<std::__cxx11::string,int,int>>>
      ::emplace_back<char_const*,int&,int&>(this_00,__args,(int *)in_RSI,(int *)__args_2);
      __gnu_cxx::
      __normal_iterator<rlottie::internal::model::Object_**,_std::vector<rlottie::internal::model::Object_*,_std::allocator<rlottie::internal::model::Object_*>_>_>
      ::operator++(&local_28);
    }
  }
  return __args_2;
}

Assistant:

std::vector<LayerInfo> model::Composition::layerInfoList() const
{
    if (!mRootLayer || mRootLayer->mChildren.empty()) return {};

    std::vector<LayerInfo> result;

    result.reserve(mRootLayer->mChildren.size());

    for (auto it : mRootLayer->mChildren) {
        auto layer = static_cast<model::Layer *>(it);
        result.emplace_back(layer->name(), layer->mInFrame, layer->mOutFrame);
    }

    return result;
}